

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

void anon_unknown.dwarf_5fce8::evalCtors
               (Module *wasm,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ctors,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *keptExports)

{
  _Link_type other;
  Type *this;
  pointer puVar1;
  Function *pFVar2;
  pointer puVar3;
  Table *pTVar4;
  tuple<wasm::Global_*,_std::default_delete<wasm::Global>_> tVar5;
  pointer puVar6;
  Memory *pMVar7;
  undefined8 *puVar8;
  key_type *__k;
  value_type *__v;
  key_type *__k_00;
  long lVar9;
  size_t *psVar10;
  uintptr_t *puVar11;
  size_t sVar12;
  string *psVar13;
  ArenaVector<wasm::Expression_*> *pAVar14;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar15;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  _Base_ptr p_Var20;
  bool bVar21;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  Builder module;
  _Head_base<0UL,_wasm::Module_*,_false> _Var24;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> uVar25;
  bool bVar26;
  int iVar27;
  Unreachable *pUVar28;
  undefined8 *puVar29;
  Const *pCVar30;
  EvallingModuleRunner *pEVar31;
  iterator iVar32;
  _Rb_tree_node_base *this_00;
  ulong uVar33;
  _Rb_tree_node_base *p_Var34;
  SmallVector<wasm::Literal,_1UL> *this_01;
  HeapType type_00;
  mapped_type *pmVar35;
  long lVar36;
  ostream *poVar37;
  long lVar38;
  __uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true> _Var39;
  ulong uVar40;
  Type type_01;
  Expression **ppEVar41;
  Literal *this_02;
  undefined4 extraout_var;
  Block *right;
  Block *left;
  LocalSet *item;
  uintptr_t uVar42;
  size_type *psVar43;
  undefined1 auVar44 [8];
  size_type sVar45;
  IString *pIVar46;
  Expression *pEVar47;
  string *str;
  string_view *psVar48;
  Type type_02;
  long extraout_RDX;
  iterator __pos;
  pointer puVar49;
  Index *this_03;
  _Head_base<0UL,_wasm::Module_*,_false> _Var50;
  __uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> _Var51;
  _Link_type __p;
  DataDrop *pDVar52;
  char *pcVar53;
  bool *pbVar54;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import_2;
  _Link_type other_00;
  size_t sVar55;
  uint uVar56;
  Name *this_04;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import;
  pointer puVar57;
  pointer puVar58;
  Name name;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar59;
  Name NVar60;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar61;
  IString IVar62;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar63;
  string_view sVar64;
  Name NVar65;
  Name NVar66;
  Name NVar67;
  Name NVar68;
  Name NVar69;
  Name name_00;
  Name name_01;
  Name NVar70;
  Name NVar71;
  Name NVar72;
  Name NVar73;
  Name root;
  optional<wasm::Type> type_03;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  local_a78;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  local_a48;
  undefined1 auStack_a18 [8];
  CtorEvalExternalInterface envInterface;
  CtorEvalExternalInterface interface;
  EvallingModuleRunner instance;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_558;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_538;
  undefined1 auStack_518 [8];
  Builder builder;
  Literal local_460;
  undefined1 auStack_448 [8];
  Literals results;
  IString local_408;
  IString local_3f8;
  IString local_3e8;
  undefined1 auStack_3d8 [8];
  TableInstanceInfo info;
  __node_base local_250;
  value_type local_248;
  Type type;
  Const size_1;
  bool local_208;
  undefined1 auStack_1d8 [8];
  DataDrop drop;
  undefined1 local_198 [8];
  Const zero;
  Type local_158;
  Type originalParams;
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  undefined1 local_138 [8];
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  Const size;
  undefined1 local_b0 [8];
  Iterator __begin2;
  undefined1 auStack_98 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> localExprs;
  Builder local_78;
  Builder builder_1;
  ArenaVector<wasm::Expression_*> *local_60;
  Block *local_48;
  _Head_base<0UL,_wasm::Module_*,_false> local_40;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  
  sVar64._M_str = (char *)local_48;
  sVar64._M_len = (size_t)ctors;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (keptExports->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (keptExports->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,0,
             &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged,auStack_3d8,auStack_a18);
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&linkedInstances;
  linkedInstances._M_t._M_impl._0_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::make_unique<wasm::Module>();
  ::wasm::Name::Name((Name *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                              _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged,
                     "env");
  *(undefined4 *)&((local_40._M_head_impl)->name).super_IString.str._M_len =
       interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Block_*>._8_4_;
  *(undefined4 *)((long)&((local_40._M_head_impl)->name).super_IString.str._M_len + 4) =
       interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Block_*>._12_4_;
  *(undefined4 *)&((local_40._M_head_impl)->name).super_IString.str._M_str =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner.
       _0_4_;
  *(undefined4 *)((long)&((local_40._M_head_impl)->name).super_IString.str._M_str + 4) =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner.
       _4_4_;
  puVar49 = (wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    _Var50._M_head_impl = local_40._M_head_impl;
    pbVar54 = &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Block_*>._M_engaged;
    if (puVar49 == puVar1) break;
    pFVar2 = (puVar49->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pcVar53 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
    if ((pcVar53 != (char *)0x0) &&
       (pcVar53 == ((local_40._M_head_impl)->name).super_IString.str._M_str)) {
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ =
           instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
           super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ &
           0xffffffffffffff00;
      info.name.super_IString.str._M_str =
           (char *)((ulong)info.name.super_IString.str._M_str & 0xffffffffffffff00);
      envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
           ::wasm::ModuleUtils::copyFunction
                     (pFVar2,local_40._M_head_impl,0,0,pbVar54,
                      (_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)auStack_3d8);
      std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               auStack_3d8);
      std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               pbVar54);
      uVar25 = envModule;
      *(undefined8 *)
       ((long)envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
              super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x28) = 0;
      *(undefined8 *)
       ((long)envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
              super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x30) = 0;
      *(undefined8 *)
       ((long)envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
              super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x18) = 0;
      *(undefined8 *)
       ((long)envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
              super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x20) = 0;
      pUVar28 = MixedArena::alloc<wasm::Unreachable>(&(_Var50._M_head_impl)->allocator);
      _Var50._M_head_impl = local_40._M_head_impl;
      psVar10 = &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(Unreachable **)
       ((long)uVar25._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
              super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x60) = pUVar28;
      envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._8_8_ =
           (pFVar2->super_Importable).base.super_IString.str._M_len;
      interface.super_ExternalInterface._vptr_ExternalInterface =
           *(_func_int ***)((long)&(pFVar2->super_Importable).base + 8);
      auStack_a18 = *(undefined1 (*) [8])
                     uVar25._M_t.
                     super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                     super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      envInterface.super_ExternalInterface._vptr_ExternalInterface =
           *(_func_int ***)
            ((long)uVar25._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 8);
      envInterface.wasm._0_1_ = 0;
      local_198._0_4_ = 0;
      auStack_518 = auStack_a18;
      builder.wasm = (Module *)envInterface.super_ExternalInterface._vptr_ExternalInterface;
      std::
      make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                ((Name *)psVar10,
                 (ExternalKind *)
                 &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload
                  .super__Optional_payload_base<wasm::Block_*>._M_engaged,
                 (variant<wasm::Name,_wasm::HeapType> *)local_198);
      ::wasm::Module::addExport((unique_ptr *)_Var50._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)psVar10);
    }
    puVar49 = puVar49 + 1;
  }
  puVar3 = (wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar54 = &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Block_*>._M_engaged;
  for (puVar57 = (wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar57 != puVar3; puVar57 = puVar57 + 1
      ) {
    pTVar4 = (puVar57->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar53 = *(char **)((long)&(pTVar4->super_Importable).module + 8);
    if ((pcVar53 != (char *)0x0) &&
       (pcVar53 == ((local_40._M_head_impl)->name).super_IString.str._M_str)) {
      puVar29 = (undefined8 *)::wasm::ModuleUtils::copyTable(pTVar4,local_40._M_head_impl);
      _Var50._M_head_impl = local_40._M_head_impl;
      puVar29[5] = 0;
      puVar29[6] = 0;
      puVar29[3] = 0;
      puVar29[4] = 0;
      auStack_3d8 = (undefined1  [8])(pTVar4->super_Importable).base.super_IString.str._M_len;
      info.instance = *(EvallingModuleRunner **)((long)&(pTVar4->super_Importable).base + 8);
      auStack_a18 = (undefined1  [8])*puVar29;
      envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)puVar29[1];
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module =
           (Module *)
           ((ulong)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module &
           0xffffffffffffff00);
      auStack_518._0_4_ = 1;
      interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._8_8_ = auStack_a18;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           envInterface.super_ExternalInterface._vptr_ExternalInterface;
      std::
      make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                ((Name *)pbVar54,(ExternalKind *)auStack_3d8,
                 (variant<wasm::Name,_wasm::HeapType> *)auStack_518);
      ::wasm::Module::addExport((unique_ptr *)_Var50._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)pbVar54);
    }
  }
  envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       (wasm->globals).
       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  for (_Var50._M_head_impl =
            (Module *)
            (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
      _Var50._M_head_impl !=
      (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)
      envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      _Var50._M_head_impl =
           (Module *)
           ((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> *)
            &(_Var50._M_head_impl)->exports + 1)) {
    tVar5.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         (((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> *)
          &(_Var50._M_head_impl)->exports)->
         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)._M_t.
         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>;
    if ((*(char **)((long)tVar5.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) !=
         (char *)0x0) &&
       (*(char **)((long)tVar5.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) ==
        ((local_40._M_head_impl)->name).super_IString.str._M_str)) {
      puVar29 = (undefined8 *)
                ::wasm::ModuleUtils::copyGlobal
                          ((Global *)
                           tVar5.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
                           local_40._M_head_impl);
      puVar29[5] = 0;
      puVar29[6] = 0;
      puVar29[3] = 0;
      puVar29[4] = 0;
      auStack_518 = (undefined1  [8])local_40._M_head_impl;
      ::wasm::Literal::makeZero((Type)auStack_3d8);
      pCVar30 = ::wasm::Builder::makeConst((Builder *)auStack_518,(Literal *)auStack_3d8);
      puVar29[8] = pCVar30;
      ::wasm::Literal::~Literal((Literal *)auStack_3d8);
      _Var24._M_head_impl = local_40._M_head_impl;
      auStack_a18 = (undefined1  [8])
                    (((Name *)((long)tVar5.
                                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                     .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl +
                              0x28))->super_IString).str._M_len;
      envInterface.super_ExternalInterface._vptr_ExternalInterface =
           *(_func_int ***)
            ((long)tVar5.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30);
      envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._8_8_ = *puVar29;
      interface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)puVar29[1];
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module =
           (Module *)
           ((ulong)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module &
           0xffffffffffffff00);
      local_198._0_4_ = 3;
      interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._8_8_ =
           envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Block_*>._8_8_;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           interface.super_ExternalInterface._vptr_ExternalInterface;
      std::
      make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                ((Name *)&linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ExternalKind *)auStack_a18,(variant<wasm::Name,_wasm::HeapType> *)local_198);
      ::wasm::Module::addExport((unique_ptr *)_Var24._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                 &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  puVar6 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar54 = &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Block_*>._M_engaged;
  for (puVar58 = (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar58 != puVar6; puVar58 = puVar58 + 1
      ) {
    pMVar7 = (puVar58->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar53 = *(char **)((long)&(pMVar7->super_Importable).module + 8);
    if ((pcVar53 != (char *)0x0) &&
       (pcVar53 == ((local_40._M_head_impl)->name).super_IString.str._M_str)) {
      puVar29 = (undefined8 *)::wasm::ModuleUtils::copyMemory(pMVar7,local_40._M_head_impl);
      _Var50._M_head_impl = local_40._M_head_impl;
      puVar29[5] = 0;
      puVar29[6] = 0;
      puVar29[3] = 0;
      puVar29[4] = 0;
      auStack_3d8 = (undefined1  [8])(pMVar7->super_Importable).base.super_IString.str._M_len;
      info.instance = *(EvallingModuleRunner **)((long)&(pMVar7->super_Importable).base + 8);
      auStack_a18 = (undefined1  [8])*puVar29;
      envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)puVar29[1];
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module =
           (Module *)
           ((ulong)instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module &
           0xffffffffffffff00);
      auStack_518._0_4_ = 2;
      interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._8_8_ = auStack_a18;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           envInterface.super_ExternalInterface._vptr_ExternalInterface;
      std::
      make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                ((Name *)pbVar54,(ExternalKind *)auStack_3d8,
                 (variant<wasm::Name,_wasm::HeapType> *)auStack_518);
      ::wasm::Module::addExport((unique_ptr *)_Var50._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)pbVar54);
    }
  }
  local_a48._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a48._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a48._M_t._M_impl._0_8_ = 0;
  local_a48._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a48._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a48._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a48._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a48._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)auStack_a18,&local_a48);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map(&local_a48);
  _Var50._M_head_impl = local_40._M_head_impl;
  originalParams.id = 0;
  pEVar31 = (EvallingModuleRunner *)operator_new(0x248);
  (pEVar31->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x100000001
  ;
  (pEVar31->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0017fc10;
  this_03 = &(pEVar31->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ = &instance;
  interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Block_*>._M_engaged = false;
  interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Block_*>._9_7_ = 0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm = (Module *)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_;
  auStack_3d8 = (undefined1  [8])pbVar54;
  info.instance = pEVar31;
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)this_03,_Var50._M_head_impl,(ExternalInterface *)auStack_a18,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Block_*>._M_engaged);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Block_*>._M_engaged);
  info.instance = (EvallingModuleRunner *)0x0;
  originalParams.id = (uintptr_t)this_03;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pEVar31;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EvallingModuleRunner,_std::allocator<(anonymous_namespace)::EvallingModuleRunner>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EvallingModuleRunner,_std::allocator<(anonymous_namespace)::EvallingModuleRunner>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)auStack_3d8);
  this_04 = &(local_40._M_head_impl)->name;
  iVar32 = std::
           map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
           ::lower_bound((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                          *)local_138,this_04);
  pVar16.second = iVar32._M_node;
  pVar16.first = iVar32._M_node;
  if ((iVar32._M_node != (_Base_ptr)&linkedInstances) &&
     (bVar26 = ::wasm::IString::operator<(&this_04->super_IString,(IString *)(iVar32._M_node + 1)),
     !bVar26)) goto LAB_00134821;
  this_00 = (_Rb_tree_node_base *)operator_new(0x40);
  other_00 = (_Link_type)(this_00 + 1);
  p_Var20 = (_Base_ptr)((local_40._M_head_impl)->name).super_IString.str._M_str;
  *(size_t *)(this_00 + 1) = (this_04->super_IString).str._M_len;
  this_00[1]._M_parent = p_Var20;
  this_00[1]._M_left = (_Base_ptr)0x0;
  this_00[1]._M_right = (_Base_ptr)0x0;
  if (iVar32._M_node == (_Base_ptr)&linkedInstances) {
    if ((linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) ||
       (__p = other_00,
       bVar26 = ::wasm::IString::operator<
                          ((IString *)
                           (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1
                           ),(IString *)other_00), !bVar26)) {
LAB_001347b7:
      __p = other_00;
      pVar59 = std::
               _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
               ::_M_get_insert_unique_pos
                         ((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                           *)local_138,(key_type *)other_00);
    }
    else {
LAB_001347cb:
      auVar17._8_8_ = 0;
      auVar17._0_8_ = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar59 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar17 << 0x40);
    }
LAB_001347ce:
    iVar32._M_node = pVar59.first;
    if (pVar59.second == (_Rb_tree_node_base *)0x0) {
LAB_00134816:
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
      ::_M_drop_node((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                      *)this_00,__p);
      goto LAB_00134821;
    }
  }
  else {
    other = (_Link_type)(iVar32._M_node + 1);
    __p = other;
    bVar26 = ::wasm::IString::operator<((IString *)other_00,(IString *)other);
    if (!bVar26) {
      __p = other_00;
      bVar26 = ::wasm::IString::operator<((IString *)other,(IString *)other_00);
      if (bVar26) {
        if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left == iVar32._M_node)
        goto LAB_001347cb;
        p_Var34 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar32._M_node);
        pVar59.second = p_Var34;
        pVar59.first = p_Var34;
        __p = (_Link_type)(p_Var34 + 1);
        bVar26 = ::wasm::IString::operator<((IString *)other_00,(IString *)__p);
        if (!bVar26) goto LAB_001347b7;
        if ((iVar32._M_node)->_M_right == (_Base_ptr)0x0) {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = iVar32._M_node;
          pVar59 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar19 << 0x40);
          goto LAB_001347d9;
        }
        goto LAB_001347ce;
      }
      goto LAB_00134816;
    }
    pVar59.second = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pVar59.first = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == iVar32._M_node)
    goto LAB_001347ce;
    uVar33 = std::_Rb_tree_decrement(iVar32._M_node);
    __p = other_00;
    bVar26 = ::wasm::IString::operator<((IString *)(uVar33 + 0x20),(IString *)other_00);
    if (!bVar26) goto LAB_001347b7;
    pVar59 = pVar16;
    if (*(long *)(uVar33 + 0x18) != 0) goto LAB_001347ce;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar33;
    pVar59 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar18 << 0x40);
  }
LAB_001347d9:
  p_Var34 = pVar59.second;
  bVar26 = true;
  if (((_Rb_tree_node_base *)&linkedInstances != p_Var34) &&
     (pVar59.first == (_Rb_tree_node_base *)0x0)) {
    bVar26 = ::wasm::IString::operator<((IString *)other_00,(IString *)(p_Var34 + 1));
  }
  std::_Rb_tree_insert_and_rebalance(bVar26,this_00,p_Var34,(_Rb_tree_node_base *)&linkedInstances);
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       ((long)&(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color + 1
       );
  iVar32._M_node = this_00;
LAB_00134821:
  iVar32._M_node[1]._M_left = (_Base_ptr)originalParams.id;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar32._M_node[1]._M_right,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map(&local_a78,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_138);
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged,&local_a78);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map(&local_a78);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&keptExportsSet._M_h._M_single_bucket,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_138);
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)
             &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged,wasm,
             (ExternalInterface *)
             &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&keptExportsSet._M_h._M_single_bucket);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&keptExportsSet._M_h._M_single_bucket);
  (**(code **)((long)&((((instance.
                          super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                          exceptionStack.flexible.
                          super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).exn.field_0.
                        gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->values).super_SmallVector<wasm::Literal,_1UL> + 0x10))
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             exceptionStack.flexible.
             super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm,
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_);
  puVar8 = *(undefined8 **)
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x38);
  for (puVar29 = *(undefined8 **)
                  (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x30
                  ); puVar29 != puVar8; puVar29 = puVar29 + 1) {
    __k = (key_type *)*puVar29;
    if (__k[2].super_IString.str._M_len == 0) {
      ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)auStack_3d8,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                 &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Block_*>._M_engaged,
                 (Expression *)__k[4].super_IString.str._M_len);
      this_01 = &std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                               *)&instance.
                                  super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>
                                  .wasm,__k)->super_SmallVector<wasm::Literal,_1UL>;
      ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                (this_01,(SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
    }
  }
  (**(code **)&((array<wasm::Literal,_1UL> *)
               ((long)&((((instance.
                           super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                           exceptionStack.flexible.
                           super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).exn.field_0.
                         gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->values).super_SmallVector<wasm::Literal,_1UL> + 8))->_M_elems[0].field_0)
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             exceptionStack.flexible.
             super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_);
  _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       *(tuple<wasm::Module_*,_std::default_delete<wasm::Module>_> *)
        &((_Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_> *)
         (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0xb0))->
         super__Head_base<0UL,_wasm::Module_*,_false>;
  envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  for (_Var50._M_head_impl =
            ((_Head_base<0UL,_wasm::Module_*,_false> *)
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0xa8))->
            _M_head_impl;
      (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)_Var50._M_head_impl !=
      (_Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>)
      _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      _Var50._M_head_impl = (Module *)((long)&(_Var50._M_head_impl)->exports + 8)) {
    uVar33 = (*(IString **)&(_Var50._M_head_impl)->exports)[5].str._M_len;
    if (((uint)uVar33 & 3) == 2 && 6 < uVar33) {
      ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                ((TableInstanceInfo *)auStack_3d8,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                 &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Block_*>._M_engaged,
                 (Name)(*(IString **)&(_Var50._M_head_impl)->exports)->str);
      type_00 = ::wasm::Type::getHeapType((Type *)(*(long *)&(_Var50._M_head_impl)->exports + 0x50))
      ;
      ::wasm::Literal::makeNull((Literal *)auStack_518,type_00);
      sVar12 = info.name.super_IString.str._M_len;
      pEVar31 = info.instance;
      auVar44 = auStack_3d8;
      for (uVar33 = 0; uVar33 < *(ulong *)(*(long *)&(_Var50._M_head_impl)->exports + 0x38);
          uVar33 = uVar33 + 1) {
        (**(code **)(**(long **)((long)auVar44 + 0x200) + 0xe0))
                  (*(long **)((long)auVar44 + 0x200),pEVar31,sVar12,uVar33,auStack_518);
      }
      ::wasm::Literal::~Literal((Literal *)auStack_518);
      _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
           (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)
           (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)envModule;
    }
  }
  local_198[0] = 0xe;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  zero.value.field_0.i64 = 0;
  zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_3d8 = (undefined1  [8])((ulong)auStack_3d8 & 0xffffffff00000000);
  info.name.super_IString.str._M_len = 2;
  ::wasm::Literal::operator=
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
             (Literal *)auStack_3d8);
  ::wasm::Literal::~Literal((Literal *)auStack_3d8);
  ::wasm::Const::finalize();
  envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       *(__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true> *)
        &((__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> *)
         (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
          super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x68))->_M_t;
  this = &size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
  for (_Var50._M_head_impl =
            *(Module **)
             &((tuple<wasm::Module_*,_std::default_delete<wasm::Module>_> *)
              (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x60))->
              super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>;
      (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
      _Var50._M_head_impl !=
      (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)
      envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      _Var50._M_head_impl = (Module *)((long)&(_Var50._M_head_impl)->exports + 8)) {
    __v = *(value_type **)&(_Var50._M_head_impl)->exports;
    if (__v[2].super_IString.str._M_len != 0) {
      linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT71(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,0xe);
      size.value.field_0.i64 = 0;
      size.value.field_0.func.super_IString.str._M_str = (char *)0x0;
      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
      auStack_3d8._0_4_ =
           (int)(__v[4].super_IString.str._M_len - (long)__v[3].super_IString.str._M_str >> 3);
      info.name.super_IString.str._M_len = 2;
      ::wasm::Literal::operator=((Literal *)this,(Literal *)auStack_3d8);
      ::wasm::Literal::~Literal((Literal *)auStack_3d8);
      ::wasm::Const::finalize();
      auStack_3d8[0] = 0x33;
      info.instance = (EvallingModuleRunner *)0x0;
      info.name.super_IString.str._M_len = (__v->super_IString).str._M_len;
      info.name.super_IString.str._M_str = (__v->super_IString).str._M_str;
      ::wasm::TableInit::finalize();
      ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)auStack_518,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                 &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Block_*>._M_engaged,(Expression *)auStack_3d8);
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)auStack_518);
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   droppedDataSegments._M_h._M_single_bucket,__v);
      ::wasm::Literal::~Literal((Literal *)this);
    }
  }
  ::wasm::Literal::~Literal
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
  puVar8 = *(undefined8 **)
            (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x80);
  for (puVar29 = *(undefined8 **)
                  (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                   super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x78
                  ); puVar29 != puVar8; puVar29 = puVar29 + 1) {
    __k_00 = (key_type *)*puVar29;
    pmVar35 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&instance.
                               super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                               droppedElementSegments._M_h._M_single_bucket,__k_00);
    pmVar35->addr = (address64_t)__k_00[3].super_IString.str._M_str;
  }
  pbVar54 = &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Block_*>._M_engaged;
  _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)
       (*(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0x98)
        - *(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                   0x90) >> 3);
  envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  for (_Var50._M_head_impl = (Module *)0x0;
      _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl !=
      (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)_Var50._M_head_impl;
      _Var50._M_head_impl = (Module *)((long)&(_Var50._M_head_impl)->exports + 1)) {
    lVar38 = *(long *)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      0x90);
    lVar9 = *(long *)(lVar38 + (long)_Var50._M_head_impl * 8);
    if (*(char *)(lVar9 + 0x28) == '\0') {
      NVar60.super_IString.str._M_str = *(char **)(lVar9 + 0x18);
      NVar60.super_IString.str._M_len._0_4_ =
           instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
           super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
      NVar60.super_IString.str._M_len._4_4_ =
           instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
           super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
      lVar36 = ::wasm::Module::getMemory(NVar60);
      local_198[0] = 0xe;
      zero.value.field_0.i64 = 0;
      zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
      zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
      zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
      zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
      ::wasm::Literal::makeFromInt32((Literal *)auStack_3d8,0,(Type)*(uintptr_t *)(lVar36 + 0x50));
      ::wasm::Literal::operator=
                ((Literal *)
                 &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                 (Literal *)auStack_3d8);
      ::wasm::Literal::~Literal((Literal *)auStack_3d8);
      ::wasm::Const::finalize();
      type.id._0_1_ = 0xe;
      size_1.value.field_0.i64 = 0;
      size_1.value.field_0.func.super_IString.str._M_str = (char *)0x0;
      size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
      size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
      size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
      lVar9 = *(long *)(lVar38 + (long)_Var50._M_head_impl * 8);
      ::wasm::Literal::makeFromInt32
                ((Literal *)auStack_3d8,*(int *)(lVar9 + 0x40) - *(int *)(lVar9 + 0x38),
                 (Type)*(uintptr_t *)(lVar36 + 0x50));
      ::wasm::Literal::operator=
                ((Literal *)
                 &size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
                 (Literal *)auStack_3d8);
      ::wasm::Literal::~Literal((Literal *)auStack_3d8);
      ::wasm::Const::finalize();
      auStack_3d8[0] = 0x24;
      info.instance = (EvallingModuleRunner *)0x0;
      psVar10 = *(size_t **)(lVar38 + (long)_Var50._M_head_impl * 8);
      info.name.super_IString.str._M_len = *psVar10;
      info.name.super_IString.str._M_str = (char *)psVar10[1];
      ::wasm::MemoryInit::finalize();
      auStack_1d8[0] = DataDropId;
      drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
      drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
      puVar11 = *(uintptr_t **)(lVar38 + (long)_Var50._M_head_impl * 8);
      drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id = *puVar11;
      drop.segment.super_IString.str._M_len = puVar11[1];
      ::wasm::DataDrop::finalize();
      ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)auStack_518,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)pbVar54,
                 (Expression *)auStack_3d8);
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)auStack_518);
      ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)&linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)pbVar54,
                 (Expression *)auStack_1d8);
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)
                 &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::wasm::Literal::~Literal
                ((Literal *)
                 &size_1.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
      ::wasm::Literal::~Literal
                ((Literal *)
                 &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type);
      _Var51._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
           (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)
           (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)envModule;
    }
  }
  pcVar53 = *(char **)(instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ +
                      200);
  if (pcVar53 != (char *)0x0) {
    info.name.super_IString.str._M_len = 0;
    info.name.super_IString.str._M_str = (char *)0x0;
    auStack_3d8 = (undefined1  [8])0x0;
    info.instance = (EvallingModuleRunner *)0x0;
    sVar12 = *(size_t *)
              (instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ + 0xc0);
    ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)
               &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
    name.super_IString.str._M_str = pcVar53;
    name.super_IString.str._M_len = sVar12;
    ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
              ((Literals *)auStack_518,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
               &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Block_*>._M_engaged,name,
               (Literals *)&linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_518);
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)
               &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
  }
  interface.usedGlobalNames._M_h._M_single_bucket._0_1_ = 1;
  str = (ctors->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  psVar13 = (ctors->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
LAB_00134ea0:
  local_48 = (Block *)sVar64._M_str;
  if (str != psVar13) {
    if ((anonymous_namespace)::quiet == '\0') {
      poVar37 = std::operator<<((ostream *)&std::cout,"trying to eval ");
      poVar37 = std::operator<<(poVar37,(string *)str);
      std::operator<<(poVar37,'\n');
    }
    ::wasm::IString::IString(&local_408,str);
    NVar65.super_IString.str._M_str = (char *)local_408.str._M_len;
    NVar65.super_IString.str._M_len = (size_t)wasm;
    lVar38 = ::wasm::Module::getExportOrNull(NVar65);
    if ((lVar38 == 0) || (*(int *)(lVar38 + 0x10) != 0)) {
      ::wasm::Fatal::Fatal((Fatal *)auStack_3d8);
      std::operator<<((ostream *)&info.name,"export not found: ");
      ::wasm::Fatal::operator<<((Fatal *)auStack_3d8,str);
      ::wasm::Fatal::~Fatal((Fatal *)auStack_3d8);
    }
    puVar29 = (undefined8 *)(lVar38 + 0x18);
    if (*(char *)(lVar38 + 0x28) != '\0') {
      puVar29 = (undefined8 *)0x0;
    }
    envInstance.
    super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar29;
    pcVar53 = (char *)puVar29[1];
    ::wasm::IString::IString(&local_3f8,str);
    sVar12 = local_3f8.str._M_len;
    builder_1.wasm =
         (Module *)
         instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
    NVar66.super_IString.str._M_str =
         (char *)envInstance.
                 super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    NVar66.super_IString.str._M_len._0_4_ =
         instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations;
    NVar66.super_IString.str._M_len._4_4_ =
         instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior;
    _Var39.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
         (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)
         ::wasm::Module::getFunction(NVar66);
    if (*(long *)((long)_Var39.
                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x20) == 0) {
      lVar38 = ::wasm::Function::getNumParams();
      envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
           (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
           _Var39.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
      if ((lVar38 == 0) || ((anonymous_namespace)::ignoreExternalInput != '\0')) {
        drop.segment.super_IString.str._M_str = (char *)0x0;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression.type.id = 0;
        drop.segment.super_IString.str._M_len = 0;
        auStack_1d8 = (undefined1  [8])0x0;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._id = InvalidId;
        drop.super_SpecificExpression<(wasm::Expression::Id)37>.super_Expression._1_7_ = 0;
        uVar33 = 0;
        while( true ) {
          uVar40 = ::wasm::Function::getNumParams();
          if (uVar40 <= uVar33) break;
          type_01.id = ::wasm::Function::getLocalType
                                 ((uint)envModule._M_t.
                                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                                        .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl);
          bVar26 = ::wasm::LiteralUtils::canMakeZero(type_01);
          if (!bVar26) {
            if ((anonymous_namespace)::quiet == '\0') {
              std::operator<<((ostream *)&std::cout,"  ...stopping due to non-zeroable param\n");
            }
            local_208 = false;
            goto LAB_00135908;
          }
          ::wasm::Literal::makeZero((Type)auStack_3d8);
          ::wasm::SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_1d8,(Literal *)auStack_3d8);
          ::wasm::Literal::~Literal((Literal *)auStack_3d8);
          uVar33 = (ulong)((int)uVar33 + 1);
        }
        auStack_98 = (undefined1  [8])0x0;
        localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_00135042:
        uVar25._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
             envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
             super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
        local_78.wasm = builder_1.wasm;
        __begin2.index =
             (size_t)::wasm::Builder::blockify
                               (&local_78,
                                *(Expression **)
                                 ((long)envModule._M_t.
                                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                                        .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl +
                                 0x60),(Expression *)0x0);
        ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
        FunctionScope((FunctionScope *)local_198,
                      (Function *)
                      uVar25._M_t.
                      super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl,
                      (Literals *)auStack_1d8,
                      (EvallingModuleRunner *)
                      &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                       _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged);
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
        results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
        str._M_str = (char *)0x0;
        auStack_448 = (undefined1  [8])0x0;
        results.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        local_60 = (ArenaVector<wasm::Expression_*> *)(__begin2.index + 0x20);
        __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
        pAVar14 = *(ArenaVector<wasm::Expression_*> **)(__begin2.index + 0x28);
        local_48 = (Block *)((ulong)local_48 & 0xffffffff00000000);
        local_b0 = (undefined1  [8])local_60;
        do {
          if ((__begin2.parent == pAVar14) && (local_b0 == (undefined1  [8])local_60))
          goto LAB_00135443;
          ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                     ::operator*((Iterator *)local_b0);
          info.name.super_IString.str._M_len = 0;
          info.name.super_IString.str._M_str = (char *)0x0;
          auStack_3d8 = (undefined1  [8])0x0;
          info.instance = (EvallingModuleRunner *)0x0;
          psVar10 = &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                    ((Flow *)psVar10,
                     (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                     &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                      _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged,*ppEVar41);
          ::wasm::Flow::operator=((Flow *)auStack_3d8,(Flow *)psVar10);
          ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)psVar10);
          if (_extendLowUToI32x4 == 0) {
            if ((anonymous_namespace)::quiet == '\0') {
              std::operator<<((ostream *)&std::cout,"  ...stopping due to non-constant flow\n");
            }
            bVar26 = true;
            iVar27 = 8;
LAB_00135347:
            bVar21 = false;
          }
          else {
            if (_replaceLaneI64x2 == 0) {
              this_02 = ::wasm::SmallVector<wasm::Literal,_1UL>::back
                                  ((SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
              NVar60 = ::wasm::Literal::getFunc(this_02);
              NVar67.super_IString.str._M_str = NVar60.super_IString.str._M_len;
              NVar67.super_IString.str._M_len = (size_t)builder_1.wasm;
              envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
              super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
                   (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
                   ::wasm::Module::getFunction(NVar67);
              ::wasm::SmallVector<wasm::Literal,_1UL>::pop_back
                        ((SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
              ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                        ((SmallVector<wasm::Literal,_1UL> *)auStack_1d8,
                         (SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
              if ((undefined1  [8])
                  localExprs.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != auStack_98) {
                localExprs.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)auStack_98;
              }
              IVar61 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                        )::wasm::SmallVector<wasm::Literal,_1UL>::end
                                   ((SmallVector<wasm::Literal,_1UL> *)auStack_1d8);
              lVar38 = -0x18;
              for (sVar55 = 0; IVar15.index = sVar55,
                  IVar15.parent = (SmallVector<wasm::Literal,_1UL> *)auStack_1d8, IVar61 != IVar15;
                  sVar55 = sVar55 + 1) {
                pDVar52 = (DataDrop *)(drop.segment.super_IString.str._M_str + lVar38);
                if (sVar55 == 0) {
                  pDVar52 = &drop;
                }
                ::wasm::Literal::Literal(&local_460,(Literal *)pDVar52);
                linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)CtorEvalExternalInterface::getSerialization
                                       ((CtorEvalExternalInterface *)
                                        &envInterface.startBlock.
                                         super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                                         super__Optional_payload_base<wasm::Block_*>._M_engaged,
                                        &local_460,(Name)ZEXT816(0));
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_98
                           ,(Expression **)
                            &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
                ::wasm::Literal::~Literal(&local_460);
                lVar38 = lVar38 + 0x18;
              }
              CtorEvalExternalInterface::applyToModule
                        ((CtorEvalExternalInterface *)
                         &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                          _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged);
              bVar26 = false;
              iVar27 = 5;
              goto LAB_00135347;
            }
            if ((undefined1  [8])
                localExprs.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start != auStack_98) {
              localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_98;
            }
            uVar56 = 0;
            while( true ) {
              uVar33 = ::wasm::Function::getNumLocals();
              if (uVar33 <= uVar56) break;
              linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)CtorEvalExternalInterface::getSerialization
                                     ((CtorEvalExternalInterface *)
                                      &envInterface.startBlock.
                                       super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
                                       super__Optional_payload_base<wasm::Block_*>._M_engaged,
                                      (Literals *)
                                      ((ulong)uVar56 * 0x38 +
                                      CONCAT44(local_198._4_4_,local_198._0_4_)),(Name)ZEXT816(0));
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_98,
                         (Expression **)
                         &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
              uVar56 = uVar56 + 1;
            }
            CtorEvalExternalInterface::applyToModule
                      ((CtorEvalExternalInterface *)
                       &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                        _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged);
            ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_448,
                       (SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
            local_48 = (Block *)CONCAT44(local_48._4_4_,(int)local_48 + 1);
            bVar26 = false;
            bVar21 = true;
            iVar27 = 0;
          }
          ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_3d8);
          if (!bVar21) goto LAB_0013543a;
          __begin2.parent =
               (ArenaVector<wasm::Expression_*> *)
               ((long)&((__begin2.parent)->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data + 1);
        } while( true );
      }
      if ((anonymous_namespace)::quiet == '\0') {
        std::operator<<((ostream *)&std::cout,"  ...stopping due to params\n");
        std::operator<<((ostream *)&std::cout,
                        "\n       recommendation: consider --ignore-external-input");
      }
    }
    else if ((anonymous_namespace)::quiet == '\0') {
      poVar37 = std::operator<<((ostream *)&std::cout,
                                "  ...stopping since could not eval: call import: ");
      ::wasm::IString::toString_abi_cxx11_
                ((string *)auStack_3d8,
                 (IString *)
                 ((long)_Var39.
                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x18));
      poVar37 = std::operator<<(poVar37,(string *)auStack_3d8);
      poVar37 = std::operator<<(poVar37,".");
      ::wasm::IString::toString_abi_cxx11_
                ((string *)&linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (IString *)
                 ((long)_Var39.
                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x28));
      poVar37 = std::operator<<(poVar37,(string *)
                                        &linkedInstances._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
      std::operator<<(poVar37,'\n');
      std::__cxx11::string::~string
                ((string *)&linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)auStack_3d8);
    }
    goto LAB_00135bba;
  }
LAB_00135be2:
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
             &interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged);
  CtorEvalExternalInterface::~CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  CtorEvalExternalInterface::~CtorEvalExternalInterface((CtorEvalExternalInterface *)auStack_a18);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&local_40);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)local_138);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
LAB_0013543a:
  if (!bVar26) goto LAB_001358ae;
LAB_00135443:
  uVar33 = (ulong)local_48 & 0xffffffff;
  if (((*(long *)((long)envModule._M_t.
                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x20) == 0) &&
      (*(ulong *)(__begin2.index + 0x28) <= uVar33)) ||
     ((((int)local_48 == 0 &&
       (*(char **)((long)envModule._M_t.
                         super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 8) == pcVar53))
      && (((undefined1  [8])
           localExprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_start == auStack_98 ||
          (lVar38 = ::wasm::HeapType::getSignature(), lVar38 == 0)))))) {
LAB_00135879:
    if (*(ulong *)(__begin2.index + 0x28) == uVar33) {
      std::_Optional_payload_base<wasm::Literals>::_Optional_payload_base<wasm::Literals&>
                ((_Optional_payload_base<wasm::Literals> *)&type,auStack_448);
      iVar27 = 1;
      goto LAB_001358ae;
    }
  }
  else {
    module.wasm = builder_1.wasm;
    _Var23._M_pi = envInstance.
                   super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
    NVar68.super_IString.str._M_str =
         (char *)envInstance.
                 super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    NVar68.super_IString.str._M_len = (size_t)builder_1.wasm;
    lVar38 = ::wasm::Module::getFunction(NVar68);
    local_b0 = *(undefined1 (*) [8])(lVar38 + 0x38);
    root.super_IString.str._M_str = pcVar53;
    root.super_IString.str._M_len = (size_t)_Var23._M_pi;
    IVar62.str = (string_view)::wasm::Names::getValidFunctionName(module.wasm,root);
    local_60 = (ArenaVector<wasm::Expression_*> *)IVar62.str._M_len;
    NVar69.super_IString.str._M_str = (char *)sVar12;
    NVar69.super_IString.str._M_len = (size_t)module.wasm;
    lVar38 = ::wasm::Module::getExport(NVar69);
    auVar44 = local_b0;
    pIVar46 = (IString *)(lVar38 + 0x18);
    if (*(char *)(lVar38 + 0x28) != '\0') {
      pIVar46 = (IString *)0x0;
    }
    pIVar46->str = IVar62.str;
    if (*(long *)((long)envModule._M_t.
                        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x20) == 0) {
      iVar27 = ::wasm::ExpressionManipulator::copy
                         (*(EVP_PKEY_CTX **)
                           ((long)envModule._M_t.
                                  super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                                  .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x60)
                          ,(EVP_PKEY_CTX *)builder_1.wasm);
      right = ::wasm::Builder::blockify
                        (&local_78,(Expression *)CONCAT44(extraout_var,iVar27),(Expression *)0x0);
      for (sVar55 = 0; uVar33 != sVar55; sVar55 = sVar55 + 1) {
        pEVar47 = (Expression *)MixedArena::alloc<wasm::Nop>(&(local_78.wasm)->allocator);
        ppEVar41 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             (&(right->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              ,sVar55);
        *ppEVar41 = pEVar47;
      }
      left = MixedArena::alloc<wasm::Block>(&(local_78.wasm)->allocator);
      for (uVar56 = 0;
          (ulong)uVar56 <
          (ulong)((long)localExprs.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)auStack_98 >> 3);
          uVar56 = uVar56 + 1) {
        item = ::wasm::Builder::makeLocalSet
                         (&local_78,uVar56,*(pointer)((long)auStack_98 + (ulong)uVar56 * 8));
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(left->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)item);
      }
      type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (right->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
      local_48 = ::wasm::Builder::makeSequence
                           (&local_78,(Expression *)left,(Expression *)right,type_03);
      linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
      size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
      local_158.id = ::wasm::HeapType::getSignature();
      uVar42 = ::wasm::HeapType::getSignature();
      if (local_158.id != uVar42) {
        local_250._M_nxt = (_Hash_node_base *)::wasm::HeapType::getSignature();
        auStack_3d8 = (undefined1  [8])&local_250;
        info.instance = (EvallingModuleRunner *)0x0;
        PVar63 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 ::wasm::Type::end((Type *)auStack_3d8);
        for (; PVar22.index = (size_t)info.instance, PVar22.parent = (Type *)auStack_3d8,
            PVar63 != PVar22;
            info.instance =
                 (EvallingModuleRunner *)
                 ((long)&((info.instance)->
                         super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
                         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.
                         _vptr_ExpressionRunner + 1)) {
          psVar43 = (size_type *)::wasm::Type::Iterator::operator*((Iterator *)auStack_3d8);
          local_248.id = *psVar43;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_248);
        }
        sVar55 = ::wasm::Type::size(&local_158);
        if (sVar55 != 0) {
          ::wasm::FindAll<wasm::LocalGet>::FindAll
                    ((FindAll<wasm::LocalGet> *)auStack_3d8,(Expression *)local_48);
          for (auVar44 = auStack_3d8; auVar44 != (undefined1  [8])info.instance;
              auVar44 = (undefined1  [8])((long)auVar44 + 8)) {
            *(int *)&(*(_Hash_node_base **)auVar44)[2]._M_nxt =
                 *(int *)&(*(_Hash_node_base **)auVar44)[2]._M_nxt + (int)sVar55;
          }
          std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
                    ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                     auStack_3d8);
          ::wasm::FindAll<wasm::LocalSet>::FindAll
                    ((FindAll<wasm::LocalSet> *)auStack_3d8,(Expression *)local_48);
          for (auVar44 = auStack_3d8; auVar44 != (undefined1  [8])info.instance;
              auVar44 = (undefined1  [8])((long)auVar44 + 8)) {
            *(int *)&(*(_Hash_node_base **)auVar44)[2]._M_nxt =
                 *(int *)&(*(_Hash_node_base **)auVar44)[2]._M_nxt + (int)sVar55;
          }
          std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
                    ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                     auStack_3d8);
        }
      }
      psVar10 = &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)psVar10,
                 (const_iterator)
                 size.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_,
                 *(Type **)((long)envModule._M_t.
                                  super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                                  .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x48)
                 ,*(Type **)((long)envModule._M_t.
                                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                                   .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x50
                            ));
      name_01.super_IString.str._M_str = (char *)local_60;
      name_01.super_IString.str._M_len = (size_t)auStack_3d8;
      ::wasm::Builder::makeFunction
                (name_01,(HeapType)IVar62.str._M_str,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0,(Expression *)psVar10);
      ::wasm::Module::addFunction((unique_ptr *)builder_1.wasm);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)auStack_3d8);
      ::wasm::PassOptions::getWithDefaultOptimizationOptions();
      ::wasm::PassRunner::PassRunner
                ((PassRunner *)auStack_3d8,builder_1.wasm,(PassOptions *)auStack_518);
      ::wasm::PassOptions::~PassOptions((PassOptions *)auStack_518);
      ::wasm::PassRunner::addDefaultFunctionOptimizationPasses();
      ::wasm::PassRunner::runOnFunction((Function *)auStack_3d8);
      ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_3d8);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_00135879;
    }
    info.name.super_IString.str._M_len = 0;
    auStack_3d8 = (undefined1  [8])0x0;
    info.instance = (EvallingModuleRunner *)0x0;
    NVar60.super_IString.str =
         *(IString *)
          envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
          super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    ::wasm::HeapType::getSignature();
    ::wasm::Builder::makeCall
              (&local_78,NVar60,
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_98,type_02
               ,true);
    name_00.super_IString.str._M_str = (char *)local_60;
    name_00.super_IString.str._M_len =
         (size_t)&linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
    ::wasm::Builder::makeFunction
              (name_00,(HeapType)IVar62.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auVar44,(Expression *)auStack_3d8)
    ;
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_3d8);
    ::wasm::Module::addFunction((unique_ptr *)builder_1.wasm);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  local_208 = false;
  iVar27 = 1;
LAB_001358ae:
  sVar64._M_str = (char *)local_48;
  sVar64._M_len = (size_t)local_60;
  ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)auStack_448);
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
  ~FunctionScope((FunctionScope *)local_198);
  if (iVar27 != 5) goto code_r0x001358d7;
  goto LAB_00135042;
code_r0x001358d7:
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_98);
LAB_00135908:
  ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)auStack_1d8);
  if ((local_208 & 1U) == 0) {
LAB_00135bba:
    if ((anonymous_namespace)::quiet == '\0') {
      std::operator<<((ostream *)&std::cout,"  ...stopping\n");
    }
    std::_Optional_payload_base<wasm::Literals>::_M_reset
              ((_Optional_payload_base<wasm::Literals> *)&type);
    goto LAB_00135be2;
  }
  if ((anonymous_namespace)::quiet == '\0') {
    poVar37 = std::operator<<((ostream *)&std::cout,"  ...success on ");
    poVar37 = std::operator<<(poVar37,(string *)str);
    std::operator<<(poVar37,".\n");
  }
  ::wasm::IString::IString(&local_3e8,str);
  NVar70.super_IString.str._M_str = (char *)local_3e8.str._M_len;
  NVar70.super_IString.str._M_len = (size_t)wasm;
  envModule._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       ::wasm::Module::getExport(NVar70);
  sVar45 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,str);
  if (sVar45 == 0) {
    NVar72.super_IString.str._M_str =
         *(char **)envModule._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    NVar72.super_IString.str._M_len = (size_t)wasm;
    ::wasm::Module::removeExport(NVar72);
  }
  else {
    pcVar53 = (char *)0x0;
    if (*(int *)((long)envModule._M_t.
                       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x10) == 0) {
      puVar29 = (undefined8 *)
                ((long)envModule._M_t.
                       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x18);
      if (*(char *)((long)envModule._M_t.
                          super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                          .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 0x28) != '\0'
         ) {
        puVar29 = (undefined8 *)0x0;
      }
      pcVar53 = (char *)*puVar29;
    }
    NVar71.super_IString.str._M_str = pcVar53;
    NVar71.super_IString.str._M_len = (size_t)wasm;
    pIVar46 = (IString *)::wasm::Module::getFunction(NVar71);
    sVar64 = (string_view)::wasm::Names::getValidFunctionName(wasm,(Name)pIVar46->str);
    local_558._M_engaged = false;
    local_538._M_engaged = false;
    lVar38 = ::wasm::ModuleUtils::copyFunction
                       (pIVar46,wasm,sVar64._M_len,sVar64._M_str,&local_558,&local_538);
    std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
              (&local_538);
    std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
              (&local_558);
    ::wasm::HeapType::getSignature();
    if (extraout_RDX == 0) {
      pEVar47 = (Expression *)MixedArena::alloc<wasm::Nop>(&wasm->allocator);
    }
    else {
      pEVar47 = CtorEvalExternalInterface::getSerialization
                          ((CtorEvalExternalInterface *)
                           &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                            _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged,
                           (Literals *)&type,(Name)ZEXT816(0));
    }
    *(Expression **)(lVar38 + 0x60) = pEVar47;
    NVar73.super_IString.str._M_str =
         *(char **)envModule._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    NVar73.super_IString.str._M_len = (size_t)wasm;
    lVar38 = ::wasm::Module::getExport(NVar73);
    psVar48 = (string_view *)(lVar38 + 0x18);
    if (*(char *)(lVar38 + 0x28) != '\0') {
      psVar48 = (string_view *)0x0;
    }
    *psVar48 = sVar64;
  }
  std::_Optional_payload_base<wasm::Literals>::_M_reset
            ((_Optional_payload_base<wasm::Literals> *)&type);
  str = str + 1;
  goto LAB_00134ea0;
}

Assistant:

void evalCtors(Module& wasm,
               std::vector<std::string>& ctors,
               std::vector<std::string>& keptExports) {
  std::unordered_set<std::string> keptExportsSet(keptExports.begin(),
                                                 keptExports.end());

  std::map<Name, std::shared_ptr<EvallingModuleRunner>> linkedInstances;

  // build and link the env module
  auto envModule = buildEnvModule(wasm);
  CtorEvalExternalInterface envInterface;
  auto envInstance =
    std::make_shared<EvallingModuleRunner>(*envModule, &envInterface);
  linkedInstances[envModule->name] = envInstance;

  CtorEvalExternalInterface interface(linkedInstances);
  try {
    // create an instance for evalling
    EvallingModuleRunner instance(wasm, &interface, linkedInstances);
    instance.instantiate();
    interface.instanceInitialized = true;
    // go one by one, in order, until we fail
    // TODO: if we knew priorities, we could reorder?
    for (auto& ctor : ctors) {
      if (!quiet) {
        std::cout << "trying to eval " << ctor << '\n';
      }
      Export* ex = wasm.getExportOrNull(ctor);
      if (!ex || ex->kind != ExternalKind::Function) {
        Fatal() << "export not found: " << ctor;
      }
      auto funcName = *ex->getInternalName();
      auto outcome = evalCtor(instance, interface, funcName, ctor);
      if (!outcome) {
        if (!quiet) {
          std::cout << "  ...stopping\n";
        }
        return;
      }

      // Success! And we can continue to try more.
      if (!quiet) {
        std::cout << "  ...success on " << ctor << ".\n";
      }

      // Remove the export if we should.
      auto* exp = wasm.getExport(ctor);
      if (!keptExportsSet.count(ctor)) {
        wasm.removeExport(exp->name);
      } else {
        // We are keeping around the export, which should now refer to an
        // empty function since calling the export should do nothing.
        auto* func = wasm.getFunction((exp->kind == ExternalKind::Function)
                                        ? *exp->getInternalName()
                                        : Name());
        auto copyName = Names::getValidFunctionName(wasm, func->name);
        auto* copyFunc = ModuleUtils::copyFunction(func, wasm, copyName);
        if (func->getResults() == Type::none) {
          copyFunc->body = Builder(wasm).makeNop();
        } else {
          copyFunc->body = interface.getSerialization(*outcome);
        }
        *wasm.getExport(exp->name)->getInternalName() = copyName;
      }
    }
  } catch (FailToEvalException& fail) {
    // that's it, we failed to even create the instance
    if (!quiet) {
      std::cout << "  ...stopping since could not create module instance: "
                << fail.why << "\n";
    }
    return;
  }
}